

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start.cpp
# Opt level: O2

void __thiscall Start::checkForCreditsAndBetSuperFire10(Start *this,double *credits,uint *bet)

{
  ostream *poVar1;
  
  if ((*credits < (double)*bet) && (2.0 <= *credits)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Automatic change bet to min!");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Not Enough Credits for Max Bet!");
    std::endl<char,std::char_traits<char>>(poVar1);
    *bet = 2;
  }
  return;
}

Assistant:

void Start::checkForCreditsAndBetSuperFire10(double& credits, unsigned int& bet) {
	if (bet > credits && credits >= 2) {
		std::cout << "Automatic change bet to min!" << std::endl;
		std::cout << "Not Enough Credits for Max Bet!" << std::endl;
		bet = 2;
	}
}